

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

int64_t __thiscall
aeron::archive::AeronArchive::startReplay
          (AeronArchive *this,int64_t recordingId,int64_t position,int64_t length,
          string *replayChannel,int32_t replayStreamId)

{
  int64_t iVar1;
  int32_t replayStreamId_local;
  int64_t length_local;
  int64_t position_local;
  int64_t recordingId_local;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  replayStreamId_local = replayStreamId;
  length_local = length;
  position_local = position;
  recordingId_local = recordingId;
  local_38._M_unused._M_object = operator_new(0x30);
  *(AeronArchive **)local_38._M_unused._0_8_ = this;
  *(int64_t **)((long)local_38._M_unused._0_8_ + 8) = &recordingId_local;
  *(int64_t **)((long)local_38._M_unused._0_8_ + 0x10) = &position_local;
  *(int64_t **)((long)local_38._M_unused._0_8_ + 0x18) = &length_local;
  *(string **)((long)local_38._M_unused._0_8_ + 0x20) = replayChannel;
  *(int32_t **)((long)local_38._M_unused._0_8_ + 0x28) = &replayStreamId_local;
  pcStack_20 = std::
               _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:203:9)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:203:9)>
             ::_M_manager;
  iVar1 = callAndPollForResponse(this,(function<bool_(long)> *)&local_38,"start replay");
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return iVar1;
}

Assistant:

std::int64_t AeronArchive::startReplay(std::int64_t recordingId, std::int64_t position, std::int64_t length,
                                       const std::string& replayChannel, std::int32_t replayStreamId) {
    return callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return archiveProxy_->replay(recordingId, position, length, replayChannel, replayStreamId, correlationId,
                                         controlSessionId_);
        },
        "start replay");
}